

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Thing_Deactivate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  uint uVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      return 0;
    }
    uVar1 = it->activationtype;
    if ((uVar1 >> 9 & 1) != 0) {
      it->activationtype = uVar1 & 0xfffffdff;
      if ((uVar1 >> 10 & 1) != 0) {
        it->activationtype = uVar1 & 0xfffffdff | 0x100;
      }
    }
    (*(it->super_DThinker).super_DObject._vptr_DObject[0xe])(it,it);
  }
  else {
    pAVar3 = AActor::TIDHash[arg0 & 0x7f];
    while( true ) {
      if (pAVar3 == (AActor *)0x0) {
        return 0;
      }
      pAVar2 = pAVar3;
      if (pAVar3->tid == arg0) break;
      pAVar3 = pAVar3->inext;
    }
LAB_00534ba7:
    do {
      pAVar3 = pAVar3->inext;
      if (pAVar3 == (AActor *)0x0) {
        pAVar3 = (AActor *)0x0;
      }
      else if (pAVar3->tid != arg0) goto LAB_00534ba7;
      uVar1 = pAVar2->activationtype;
      if ((uVar1 >> 9 & 1) != 0) {
        pAVar2->activationtype = uVar1 & 0xfffffdff;
        if ((uVar1 >> 10 & 1) != 0) {
          pAVar2->activationtype = uVar1 & 0xfffffdff | 0x100;
        }
      }
      (*(pAVar2->super_DThinker).super_DObject._vptr_DObject[0xe])(pAVar2,it);
      pAVar2 = pAVar3;
    } while (pAVar3 != (AActor *)0x0);
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_Deactivate)
// Thing_Deactivate (tid)
{
	if (arg0 != 0)
	{
		AActor *actor;
		FActorIterator iterator (arg0);
		int count = 0;
	
		actor = iterator.Next ();
		while (actor)
		{
			// Actor might removes itself as part of deactivation, so get next
			// one before we activate it.
			AActor *temp = iterator.Next ();
			DoDeactivateThing(actor, it);
			actor = temp;
			count++;
		}
	
		return count != 0;
	}
	else if (it != NULL)
	{
		DoDeactivateThing(it, it);
		return true;
	}
	return false;
}